

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int EmitRescaledRowsYUVA(VP8LDecoder *dec,uint8_t *in,int in_stride,int mb_h)

{
  int iVar1;
  int width;
  int iVar2;
  int in_ECX;
  int in_EDX;
  WebPRescaler *in_RSI;
  long in_RDI;
  int lines_imported;
  int needed_lines;
  int lines_left;
  int y_pos;
  int num_lines_in;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = *(int *)(in_RDI + 0x94);
  while (iVar3 < in_ECX) {
    iVar1 = in_ECX - iVar3;
    width = WebPRescaleNeededLines(*(WebPRescaler **)(in_RDI + 0x188),iVar1);
    WebPMultARGBRows((uint8_t *)CONCAT44(iVar3,iVar2),iVar1,width,in_stack_ffffffffffffffd4,
                     in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd4 =
         WebPRescalerImport(in_RSI,in_EDX,(uint8_t *)CONCAT44(iVar3,iVar2),iVar1);
    iVar3 = in_stack_ffffffffffffffd4 + iVar3;
    in_RSI = (WebPRescaler *)((long)&in_RSI->x_expand + (long)(width * in_EDX));
    iVar1 = ExportYUVA((VP8LDecoder *)CONCAT44(iVar3,iVar2),iVar1);
    iVar2 = iVar1 + iVar2;
  }
  return iVar2;
}

Assistant:

static int EmitRescaledRowsYUVA(const VP8LDecoder* const dec,
                                uint8_t* in, int in_stride, int mb_h) {
  int num_lines_in = 0;
  int y_pos = dec->last_out_row_;
  while (num_lines_in < mb_h) {
    const int lines_left = mb_h - num_lines_in;
    const int needed_lines = WebPRescaleNeededLines(dec->rescaler, lines_left);
    int lines_imported;
    WebPMultARGBRows(in, in_stride, dec->rescaler->src_width, needed_lines, 0);
    lines_imported =
        WebPRescalerImport(dec->rescaler, lines_left, in, in_stride);
    assert(lines_imported == needed_lines);
    num_lines_in += lines_imported;
    in += needed_lines * in_stride;
    y_pos += ExportYUVA(dec, y_pos);
  }
  return y_pos;
}